

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void resizestack(lua_State *L,MSize n)

{
  uint uVar1;
  void *p;
  uint64_t uVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  GCRef *pGVar6;
  ulong uVar7;
  
  p = (void *)(L->stack).ptr64;
  uVar1 = L->stacksize;
  pvVar4 = lj_mem_realloc(L,p,(ulong)(uVar1 * 8),(ulong)(n * 8 + 0x48));
  (L->stack).ptr64 = (uint64_t)pvVar4;
  (L->maxstack).ptr64 = (uint64_t)((long)pvVar4 + (ulong)n * 8);
  for (uVar7 = (ulong)uVar1; uVar7 < n + 9; uVar7 = uVar7 + 1) {
    *(undefined8 *)((long)pvVar4 + uVar7 * 8) = 0xffffffffffffffff;
  }
  lVar5 = (long)pvVar4 - (long)p;
  L->stacksize = n + 9;
  uVar2 = (L->glref).ptr64;
  lVar3 = *(long *)(uVar2 + 0x178);
  if ((ulong)(lVar3 - (long)p) < (uVar7 & 0xffffffff)) {
    *(long *)(uVar2 + 0x178) = lVar3 + lVar5;
  }
  L->base = (TValue *)((long)L->base + lVar5);
  L->top = (TValue *)((long)L->top + lVar5);
  pGVar6 = &L->openupval;
  while (pGVar6 = (GCRef *)pGVar6->gcptr64, pGVar6 != (GCRef *)0x0) {
    pGVar6[4] = (GCRef)(*(long *)(pGVar6 + 4) + lVar5);
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
}